

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMatterMeshless::IntLoadResidual_Mv
          (ChMatterMeshless *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double *pdVar4;
  pointer psVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  psVar5 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    uVar7 = 1;
    uVar8 = 0;
    do {
      dVar9 = (double)(**(code **)((long)((psVar5[uVar8].
                                           super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))();
      uVar6 = (ulong)off;
      if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar6) {
LAB_00615312:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar6) {
LAB_006152f3:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pdVar4[uVar6];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar9 * c;
      auVar1 = vfmadd213sd_fma(auVar13,auVar10,auVar1);
      pdVar4[uVar6] = auVar1._0_8_;
      dVar9 = (double)(**(code **)(*(long *)&((this->nodes).
                                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                              super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->super_ChNodeXYZ + 0x90))();
      uVar6 = (ulong)(off + 1);
      if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar6) goto LAB_00615312;
      if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar6) goto LAB_006152f3;
      pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pdVar4[uVar6];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar9 * c;
      auVar1 = vfmadd213sd_fma(auVar14,auVar11,auVar2);
      pdVar4[uVar6] = auVar1._0_8_;
      dVar9 = (double)(**(code **)(*(long *)&((this->nodes).
                                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                              super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->super_ChNodeXYZ + 0x90))();
      uVar6 = (ulong)(off + 2);
      if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar6) goto LAB_00615312;
      if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar6) goto LAB_006152f3;
      pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      uVar8 = (ulong)uVar7;
      off = off + 3;
      uVar7 = uVar7 + 1;
      auVar15._8_8_ = 0;
      auVar15._0_8_ =
           (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = pdVar4[uVar6];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar9 * c;
      auVar1 = vfmadd213sd_fma(auVar15,auVar12,auVar3);
      pdVar4[uVar6] = auVar1._0_8_;
      psVar5 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4));
  }
  return;
}

Assistant:

void ChMatterMeshless::IntLoadResidual_Mv(const unsigned int off,      ///< offset in R residual
                                          ChVectorDynamic<>& R,        ///< result: the R residual, R += c*M*v
                                          const ChVectorDynamic<>& w,  ///< the w vector
                                          const double c               ///< a scaling factor
                                          ) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        R(off + 3 * j) += c * nodes[j]->GetMass() * w(off + 3 * j);
        R(off + 3 * j + 1) += c * nodes[j]->GetMass() * w(off + 3 * j + 1);
        R(off + 3 * j + 2) += c * nodes[j]->GetMass() * w(off + 3 * j + 2);
    }
}